

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OmegaOP.cpp
# Opt level: O2

void __thiscall OmegaOP::algoUNIMODAL(OmegaOP *this,vector<double,_std::allocator<double>_> *data)

{
  uint uVar1;
  void *pvVar2;
  double **ppdVar3;
  ulong uVar4;
  uint i;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  uint u;
  double dVar9;
  uint local_6c;
  Costs cost;
  uint local_64;
  void *local_60;
  uint local_58;
  uint local_54;
  ulong local_50;
  ulong local_48;
  double local_40;
  double local_38;
  
  uVar5 = (long)(data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start;
  local_48 = uVar5 >> 3;
  uVar1 = this->nbStates;
  Costs::Costs(&cost);
  local_50 = (ulong)uVar1;
  local_60 = operator_new__((ulong)uVar1 * 8);
  for (uVar6 = 0; local_50 != uVar6; uVar6 = uVar6 + 1) {
    pvVar2 = operator_new__(uVar5 >> 1 & 0x3fffffffc);
    *(void **)((long)local_60 + uVar6 * 8) = pvVar2;
  }
  ppdVar3 = preprocessing(this,data);
  this->S12P = ppdVar3;
  local_48 = (ulong)((int)local_48 + 1);
  for (local_6c = 2; local_6c < (uint)local_48; local_6c = local_6c + 1) {
    for (uVar5 = 0; uVar5 != local_50; uVar5 = uVar5 + 1) {
      local_58 = 0;
      local_64 = 1;
      local_40 = INFINITY;
      local_54 = 0;
      while( true ) {
        if (local_6c <= local_64) break;
        lVar8 = 0;
        for (uVar6 = 0; local_50 != uVar6; uVar6 = uVar6 + 1) {
          uVar4 = (ulong)local_64;
          if ((uVar5 <= uVar6) ||
             (*(int *)(*(long *)((long)local_60 + uVar6 * 8) + uVar4 * 4) != -1)) {
            local_38 = this->Q[uVar6][uVar4];
            ppdVar3 = this->S12P;
            uVar7 = (ulong)local_6c;
            dVar9 = Costs::slopeCost(&cost,(double *)((long)this->states + lVar8),
                                     this->states + uVar5,&local_64,&local_6c,*ppdVar3 + uVar4,
                                     *ppdVar3 + uVar7,ppdVar3[1] + uVar4,ppdVar3[1] + uVar7,
                                     ppdVar3[2] + uVar4,ppdVar3[2] + uVar7);
            dVar9 = dVar9 + local_38 + this->penalty;
            if (dVar9 < local_40) {
              local_58 = local_64;
              local_54 = (uint)uVar6;
              local_40 = dVar9;
            }
          }
          lVar8 = lVar8 + 8;
        }
        local_64 = local_64 + 1;
      }
      this->Q[uVar5][local_6c] = local_40;
      this->lastIndState[uVar5][local_6c] = local_54;
      this->lastChpt[uVar5][local_6c] = local_58;
      uVar6 = (ulong)local_54;
      if (uVar5 < uVar6) {
        *(undefined4 *)(*(long *)((long)local_60 + uVar5 * 8) + (ulong)local_6c * 4) = 0xffffffff;
      }
      if (uVar6 < uVar5) {
        *(undefined4 *)(*(long *)((long)local_60 + uVar5 * 8) + (ulong)local_6c * 4) = 1;
      }
      if ((uVar5 == uVar6) &&
         (lVar8 = *(long *)((long)local_60 + uVar5 * 8),
         *(int *)(lVar8 + (long)(int)local_58 * 4) == -1)) {
        *(undefined4 *)(lVar8 + (ulong)local_6c * 4) = 0xffffffff;
      }
    }
  }
  this->pruning = 1.0;
  for (uVar5 = 0; local_50 != uVar5; uVar5 = uVar5 + 1) {
    operator_delete(*(void **)((long)local_60 + uVar5 * 8));
  }
  operator_delete__(local_60);
  return;
}

Assistant:

void OmegaOP::algoUNIMODAL(std::vector< double >& data)
{
  unsigned int n = data.size();
  unsigned int p = nbStates;
  Costs cost;
  double temp_cost = 0;
  double temp_Q = -1;
  int temp_chpt = -1;
  unsigned int temp_indState = 0;

  int** SLOPE = new int*[p];
  for(unsigned int i = 0; i < p; i++){SLOPE[i] = new int[n];}

  /// PREPROCESSING
  S12P = preprocessing(data);

  ///
  /// ALGO
  /// states u to v -> time position t to T
  /// explore in (u,t) for fixed (v,T)
  ///
  for(unsigned int T = 2; T < (n + 1); T++)
  {
    for(unsigned int v = 0; v < p; v++)
    {
      ///// EXPLORE MATRIX size p*T
      temp_Q = INFINITY;
      temp_indState = 0;
      temp_chpt = 0;

      for(unsigned int t = 1; t < T; t++)
      {
        for(unsigned int u = 0; u < p; u++) /////explore column of states
        {
          if(!(u < v && SLOPE[u][t] == -1))
          {
            temp_cost = Q[u][t] + cost.slopeCost(states[u], states[v], t, T, S12P[0][t], S12P[0][T], S12P[1][t], S12P[1][T], S12P[2][t], S12P[2][T]) + penalty;
            if(temp_Q > temp_cost)
            {
              temp_Q = temp_cost;
              temp_indState = u;
              temp_chpt = t;
            }
          }
        }

      }
      /////
      ///// Write response
      /////
      Q[v][T] = temp_Q;
      lastIndState[v][T] = temp_indState;
      lastChpt[v][T] = temp_chpt;

      if(temp_indState > v){SLOPE[v][T] = -1;}
      if(temp_indState < v){SLOPE[v][T] = 1;}
      if(temp_indState == v){if(SLOPE[temp_indState][temp_chpt] == -1){SLOPE[v][T] = -1;}}
    }
  }

  pruning = 1;

  for(unsigned int i = 0; i < p; i++){delete(SLOPE[i]);}
  delete [] SLOPE;
  SLOPE = NULL;

}